

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::TextureLevelPyramid::TextureLevelPyramid
          (TextureLevelPyramid *this,TextureFormat *format,int numLevels)

{
  allocator_type local_1a;
  allocator_type local_19;
  
  this->m_format = *format;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::vector(&this->m_data,(long)numLevels,&local_19);
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (&this->m_access,(long)numLevels,&local_1a);
  return;
}

Assistant:

TextureLevelPyramid::TextureLevelPyramid (const TextureFormat& format, int numLevels)
	: m_format	(format)
	, m_data	(numLevels)
	, m_access	(numLevels)
{
}